

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O3

unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
* duckdb::ArrowTypeExtensionData::GetExtensionTypes
            (unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
             *__return_storage_ptr__,ClientContext *context,
            vector<duckdb::LogicalType,_true> *duckdb_types)

{
  bool bVar1;
  DBConfig *this;
  const_reference pvVar2;
  __hashtable *__h;
  size_type __n;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> sVar3;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  size_type local_e8;
  undefined8 local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d8;
  ArrowTypeExtension local_d0;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  this = DBConfig::GetConfig(context);
  if ((duckdb_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (duckdb_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar2 = vector<duckdb::LogicalType,_true>::operator[](duckdb_types,__n);
      bVar1 = DBConfig::HasArrowExtension(this,pvVar2);
      if (bVar1) {
        pvVar2 = vector<duckdb::LogicalType,_true>::operator[](duckdb_types,__n);
        DBConfig::GetArrowExtension(&local_d0,this,pvVar2);
        sVar3 = ArrowTypeExtension::GetTypeExtension(&local_d0);
        local_e0 = local_f8;
        p_Stack_d8 = p_Stack_f0;
        local_f8 = 0;
        p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_e8 = __n;
        ::std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)__return_storage_ptr__,&local_e8,
                   sVar3.internal.
                   super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        if (p_Stack_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d8);
        }
        if (local_d0.type_extension.internal.
            super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d0.type_extension.internal.
                     super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.extension_metadata.arrow_format._M_dataplus._M_p !=
            &local_d0.extension_metadata.arrow_format.field_2) {
          operator_delete(local_d0.extension_metadata.arrow_format._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.extension_metadata.type_name._M_dataplus._M_p !=
            &local_d0.extension_metadata.type_name.field_2) {
          operator_delete(local_d0.extension_metadata.type_name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.extension_metadata.vendor_name._M_dataplus._M_p !=
            &local_d0.extension_metadata.vendor_name.field_2) {
          operator_delete(local_d0.extension_metadata.vendor_name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.extension_metadata.extension_name._M_dataplus._M_p !=
            &local_d0.extension_metadata.extension_name.field_2) {
          operator_delete(local_d0.extension_metadata.extension_name._M_dataplus._M_p);
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(duckdb_types->
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ).
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(duckdb_types->
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ).
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  return __return_storage_ptr__;
}

Assistant:

unordered_map<idx_t, const shared_ptr<ArrowTypeExtensionData>>
ArrowTypeExtensionData::GetExtensionTypes(ClientContext &context, const vector<LogicalType> &duckdb_types) {
	unordered_map<idx_t, const shared_ptr<ArrowTypeExtensionData>> extension_types;
	const auto &db_config = DBConfig::GetConfig(context);
	for (idx_t i = 0; i < duckdb_types.size(); i++) {
		if (db_config.HasArrowExtension(duckdb_types[i])) {
			extension_types.insert({i, db_config.GetArrowExtension(duckdb_types[i]).GetTypeExtension()});
		}
	}
	return extension_types;
}